

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logging::saveLog(Logging *this)

{
  rep rVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RDI;
  int i_1;
  int i;
  uint timeSinceEpoch;
  ofstream outfile;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffbb8;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  int local_3c4;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [36];
  int local_2fc;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [48];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_228;
  rep local_220;
  duration<long,_std::ratio<1L,_1000L>_> local_218;
  undefined4 local_20c;
  ostream local_208 [520];
  
  std::ofstream::ofstream(local_208);
  local_228.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_220 = (rep)std::chrono::
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(&local_228);
  local_218.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_fffffffffffffb88);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_218);
  local_20c = (undefined4)rVar1;
  currentDateTime_abi_cxx11_();
  std::operator+((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
  std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
  std::ofstream::open(local_208,local_258,0x10);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_2d8);
  poVar2 = std::operator<<(local_208,"time,populationID,neuronID,valueType,value");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_2fc = 0;
  while( true ) {
    uVar3 = (ulong)local_2fc;
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68));
    __val = (uint)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)local_2fc);
    poVar2 = (ostream *)std::ostream::operator<<(local_208,*pvVar5);
    poVar2 = std::operator<<(poVar2,",");
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 8),(long)local_2fc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar6);
    poVar2 = std::operator<<(poVar2,",");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_2fc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
    std::operator<<(poVar2,",");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_2fc);
    poVar2 = (ostream *)std::ostream::operator<<(local_208,*pvVar7);
    poVar2 = std::operator<<(poVar2,",");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_2fc);
    in_stack_fffffffffffffbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::ostream::operator<<(poVar2,*pvVar5);
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffffbc8,std::endl<char,std::char_traits<char>>);
    local_2fc = local_2fc + 1;
  }
  std::ofstream::close();
  currentDateTime_abi_cxx11_();
  std::operator+((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
  std::__cxx11::to_string(__val);
  std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
  std::ofstream::open(local_208,local_320,0x10);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  poVar2 = std::operator<<(local_208,"time,populationID,neuronID,eventType");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_3c4 = 0;
  while( true ) {
    uVar3 = (ulong)local_3c4;
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 200));
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 200),(long)local_3c4);
    poVar2 = (ostream *)std::ostream::operator<<(local_208,*pvVar5);
    poVar2 = std::operator<<(poVar2,",");
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x80),(long)local_3c4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar6);
    poVar2 = std::operator<<(poVar2,",");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)local_3c4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar7);
    std::operator<<(poVar2,",");
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb0),(long)local_3c4);
    poVar2 = (ostream *)std::ostream::operator<<(local_208,*pvVar7);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_3c4 = local_3c4 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void Logging::saveLog() {
    ofstream outfile;
    unsigned int timeSinceEpoch = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
    outfile.open("/home/haukur/MasterProject/Logs/value_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,valueType,value" << endl;
    for(int i = 0; i < value_time.size(); i++) {
        outfile << value_time[i] << "," << value_populationID[i] << "," << value_neuronID[i] << ",";
        outfile << value_valueType[i] << "," << value_value[i] << endl;
    }
    outfile.close();
    outfile.open("/home/haukur/MasterProject/Logs/event_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,eventType" << endl;
    for(int i = 0; i < event_time.size(); i++) {
        outfile << event_time[i] << "," << event_populationID[i] << "," << event_neuronID[i] << ",";
        outfile << event_eventType[i] << endl;
    }
    outfile.close();
}